

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraKateGenerator::GenerateFilesString_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  pointer puVar3;
  pointer pbVar4;
  pointer puVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  string *psVar9;
  long lVar10;
  _Base_ptr p_Var11;
  pointer puVar12;
  string *listFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  pointer puVar13;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string mode;
  string local_b8;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  path local_58;
  
  pcVar1 = lg->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&files,"CMAKE_KATE_FILES_MODE",(allocator<char> *)&local_58);
  psVar9 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&files);
  cmsys::SystemTools::UpperCase(&mode,psVar9);
  std::__cxx11::string::~string((string *)&files);
  if (GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_ == '\0') {
    iVar8 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                 gitString_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_,
                 "\"git\": 1 ",(allocator<char> *)&files);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                           gitString_abi_cxx11_);
    }
  }
  if (GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_ == '\0') {
    iVar8 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                 svnString_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_,
                 "\"svn\": 1 ",(allocator<char> *)&files);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                           svnString_abi_cxx11_);
    }
  }
  if (GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_ == '\0') {
    iVar8 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                 hgString_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_,
                 "\"hg\": 1 ",(allocator<char> *)&files);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                           hgString_abi_cxx11_);
    }
  }
  if (GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_ == '\0') {
    iVar8 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                 fossilString_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_,
                 "\"fossil\": 1 ",(allocator<char> *)&files);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                           fossilString_abi_cxx11_);
    }
  }
  bVar6 = std::operator==(&mode,"SVN");
  if (bVar6) {
    psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_;
  }
  else {
    bVar6 = std::operator==(&mode,"GIT");
    if (bVar6) {
      psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_;
    }
    else {
      bVar6 = std::operator==(&mode,"HG");
      if (bVar6) {
        psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_;
      }
      else {
        bVar6 = std::operator==(&mode,"FOSSIL");
        if (!bVar6) {
          bVar6 = std::operator!=(&mode,"LIST");
          if (bVar6) {
            psVar9 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
            std::__cxx11::string::string((string *)&local_78,(string *)psVar9);
            cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                      ((cmCMakePath *)&files,&local_78,auto_format);
            std::__cxx11::string::~string((string *)&local_78);
            while( true ) {
              std::filesystem::__cxx11::path::string(&local_58._M_pathname,(path *)&files);
              std::operator+(&s,&local_58._M_pathname,"/.git");
              std::__cxx11::string::~string((string *)&local_58);
              bVar6 = cmsys::SystemTools::FileExists(&s);
              if (bVar6) break;
              std::filesystem::__cxx11::path::string(&local_b8,(path *)&files);
              std::operator+(&local_58._M_pathname,&local_b8,"/.svn");
              std::__cxx11::string::operator=((string *)&s,(string *)&local_58);
              std::__cxx11::string::~string((string *)&local_58);
              std::__cxx11::string::~string((string *)&local_b8);
              bVar6 = cmsys::SystemTools::FileExists(&s);
              if (bVar6) {
                psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                          svnString_abi_cxx11_;
                goto LAB_0032876b;
              }
              std::filesystem::__cxx11::path::string(&local_b8,(path *)&files);
              std::operator+(&local_58._M_pathname,&local_b8,"/.hg");
              std::__cxx11::string::operator=((string *)&s,(string *)&local_58);
              std::__cxx11::string::~string((string *)&local_58);
              std::__cxx11::string::~string((string *)&local_b8);
              bVar6 = cmsys::SystemTools::FileExists(&s);
              if (bVar6) {
                psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                          hgString_abi_cxx11_;
                goto LAB_0032876b;
              }
              std::filesystem::__cxx11::path::string(&local_b8,(path *)&files);
              std::operator+(&local_58._M_pathname,&local_b8,"/.fslckout");
              std::__cxx11::string::operator=((string *)&s,(string *)&local_58);
              std::__cxx11::string::~string((string *)&local_58);
              std::__cxx11::string::~string((string *)&local_b8);
              bVar6 = cmsys::SystemTools::FileExists(&s);
              if (bVar6) {
                psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                          fossilString_abi_cxx11_;
                goto LAB_0032876b;
              }
              cVar7 = std::filesystem::__cxx11::path::has_relative_path();
              if (cVar7 == '\0') {
                std::__cxx11::string::~string((string *)&s);
                std::filesystem::__cxx11::path::~path((path *)&files);
                goto LAB_003287a6;
              }
              cmCMakePath::GetParentPath((cmCMakePath *)&local_58,(cmCMakePath *)&files);
              cmCMakePath::operator=((cmCMakePath *)&files,(cmCMakePath *)&local_58);
              std::filesystem::__cxx11::path::~path(&local_58);
              std::__cxx11::string::~string((string *)&s);
            }
            psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_;
LAB_0032876b:
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar9);
            std::__cxx11::string::~string((string *)&s);
            std::filesystem::__cxx11::path::~path((path *)&files);
          }
          else {
LAB_003287a6:
            files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &files._M_t._M_impl.super__Rb_tree_header._M_header;
            files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
            puVar3 = (pcVar2->LocalGenerators).
                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            for (puVar12 = (pcVar2->LocalGenerators).
                           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3;
                puVar12 = puVar12 + 1) {
              pcVar1 = ((puVar12->_M_t).
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
              pbVar4 = *(pointer *)
                        ((long)&(pcVar1->ListFiles).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        + 8);
              for (__v = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          &(pcVar1->ListFiles).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl; __v != pbVar4; __v = __v + 1) {
                lVar10 = std::__cxx11::string::find((char *)__v,0x6a244f);
                if (lVar10 == -1) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&files,__v);
                }
              }
              puVar5 = *(pointer *)
                        ((long)&(pcVar1->SourceFiles).
                                super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                        + 8);
              for (puVar13 = *(pointer *)
                              &(pcVar1->SourceFiles).
                               super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                               ._M_impl; puVar13 != puVar5; puVar13 = puVar13 + 1) {
                bVar6 = cmSourceFile::GetIsGenerated
                                  ((cmSourceFile *)
                                   (puVar13->_M_t).
                                   super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                   ,GlobalAndLocal);
                if (!bVar6) {
                  cmSourceFile::ResolveFullPath
                            ((cmSourceFile *)
                             (puVar13->_M_t).
                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                             ,(string *)0x0,(string *)0x0);
                  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&files,__return_storage_ptr__);
                }
              }
            }
            std::__cxx11::string::assign((char *)__return_storage_ptr__);
            for (p_Var11 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var11 != &files._M_t._M_impl.super__Rb_tree_header;
                p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((string *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&files._M_t);
          }
          goto LAB_0032857d;
        }
        psVar9 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_;
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar9);
LAB_0032857d:
  std::__cxx11::string::~string((string *)&mode);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateFilesString(
  const cmLocalGenerator& lg) const
{
  const cmMakefile* mf = lg.GetMakefile();
  std::string mode =
    cmSystemTools::UpperCase(mf->GetSafeDefinition("CMAKE_KATE_FILES_MODE"));
  static const std::string gitString = "\"git\": 1 ";
  static const std::string svnString = "\"svn\": 1 ";
  static const std::string hgString = "\"hg\": 1 ";
  static const std::string fossilString = "\"fossil\": 1 ";

  if (mode == "SVN") {
    return svnString;
  }
  if (mode == "GIT") {
    return gitString;
  }
  if (mode == "HG") {
    return hgString;
  }
  if (mode == "FOSSIL") {
    return fossilString;
  }

  // check for the VCS files except when "forced" to "FILES" mode:
  if (mode != "LIST") {
    cmCMakePath startDir(lg.GetSourceDirectory(), cmCMakePath::auto_format);
    // move the directories up to the root directory to see whether we are in
    // a subdir of a svn, git, hg or fossil checkout
    for (;;) {
      std::string s = startDir.String() + "/.git";
      if (cmSystemTools::FileExists(s)) {
        return gitString;
      }

      s = startDir.String() + "/.svn";
      if (cmSystemTools::FileExists(s)) {
        return svnString;
      }

      s = startDir.String() + "/.hg";
      if (cmSystemTools::FileExists(s)) {
        return hgString;
      }
      s = startDir.String() + "/.fslckout";
      if (cmSystemTools::FileExists(s)) {
        return fossilString;
      }

      if (!startDir.HasRelativePath()) { // have we reached the root dir ?
        break;
      }
      startDir = startDir.GetParentPath();
    }
  }

  std::set<std::string> files;
  std::string tmp;
  const auto& lgs = this->GlobalGenerator->GetLocalGenerators();

  for (const auto& lgen : lgs) {
    cmMakefile* makefile = lgen->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::string const& listFile : listFiles) {
      if (listFile.find("/CMakeFiles/") == std::string::npos) {
        files.insert(listFile);
      }
    }

    for (const auto& sf : makefile->GetSourceFiles()) {
      if (sf->GetIsGenerated()) {
        continue;
      }

      tmp = sf->ResolveFullPath();
      files.insert(tmp);
    }
  }

  const char* sep = "";
  tmp = "\"list\": [";
  for (std::string const& f : files) {
    tmp += sep;
    tmp += " \"";
    tmp += f;
    tmp += "\"";
    sep = ",";
  }
  tmp += "] ";

  return tmp;
}